

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

size_t __thiscall Centaurus::CharClass<unsigned_char>::hash(CharClass<unsigned_char> *this)

{
  bool bVar1;
  uchar uVar2;
  reference this_00;
  size_t sVar3;
  size_t sVar4;
  Range<unsigned_char> *range;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
  *__range2;
  size_t value;
  CharClass<unsigned_char> *pCStack_10;
  hash<unsigned_char> hasher;
  CharClass<unsigned_char> *this_local;
  
  __range2 = (vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
              *)0x0;
  pCStack_10 = this;
  __end0 = std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::begin(&this->m_ranges);
  range = (Range<unsigned_char> *)
          std::
          vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
          ::end(&this->m_ranges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                *)&range);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
              ::operator*(&__end0);
    uVar2 = Range<unsigned_char>::start(this_00);
    sVar3 = std::hash<unsigned_char>::operator()((hash<unsigned_char> *)((long)&value + 7),uVar2);
    uVar2 = Range<unsigned_char>::end(this_00);
    sVar4 = std::hash<unsigned_char>::operator()((hash<unsigned_char> *)((long)&value + 7),uVar2);
    __range2 = (vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                *)(sVar4 ^ sVar3 ^ (ulong)__range2);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
    ::operator++(&__end0);
  }
  return (size_t)__range2;
}

Assistant:

size_t hash() const
    {
        std::hash<TCHAR> hasher;
        size_t value = 0;
        for (const auto& range : m_ranges)
        {
            value ^= hasher(range.start());
            value ^= hasher(range.end());
        }
        return value;
    }